

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

string * nite::strRemoveEndline(string *__return_storage_ptr__,string *Input)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  string local_78;
  undefined1 local_58 [8];
  string Buffer;
  
  local_58 = (undefined1  [8])&Buffer._M_string_length;
  Buffer._M_dataplus._M_p = (pointer)0x0;
  Buffer._M_string_length._0_1_ = 0;
  Buffer.field_2._8_8_ = __return_storage_ptr__;
  if (Input->_M_string_length != 0) {
    strAt(&local_78,Input,(int)Input->_M_string_length - 1);
    std::__cxx11::string::operator=((string *)local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    do {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"\n");
      if (!bVar2) {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"\r");
        if (!bVar2) break;
      }
      if (Input->_M_string_length == 0) break;
      std::__cxx11::string::erase((ulong)Input,Input->_M_string_length - 1);
      if (Input->_M_string_length == 0) break;
      pcVar3 = (char *)std::__cxx11::string::at((ulong)Input);
      std::__cxx11::string::operator=((string *)local_58,*pcVar3);
    } while( true );
  }
  uVar1 = Buffer.field_2._8_8_;
  std::__cxx11::string::string((string *)Buffer.field_2._8_8_,(string *)Input);
  std::__cxx11::string::~string((string *)local_58);
  return (string *)uVar1;
}

Assistant:

String nite::strRemoveEndline(String Input){
	String Buffer;
	if (Input.length()>0){
		Buffer = nite::strAt(Input,Input.length()-1);
		while ( (Buffer=="\n" or Buffer=="\r" )  && Input.length()>0 ){
			Input.erase(Input.length()-1,1);
			if (Input.length()==0)
				break;
			Buffer = Input.at(Input.length()-1);
		}
	}
	return Input;
}